

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
calculator::ZeroNumberException::ZeroNumberException(ZeroNumberException *this,int x)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  ZeroNumberException *pZStack_10;
  int x_local;
  ZeroNumberException *this_local;
  
  local_14 = x;
  pZStack_10 = this;
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError =
       &PTR__ZeroNumberException_001369c8;
  std::__cxx11::to_string(&local_58,local_14);
  std::operator+(&local_38,"Error: zero/0 number error: 0",&local_58);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_38
            );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

ZeroNumberException(int x) {
        error_msg = "Error: zero/0 number error: 0" + std::to_string(x);
    }